

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O1

void debugReportRankDeficiency
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *permute,
               vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index,
               HighsInt rank_deficiency,vector<int,_std::allocator<int>_> *row_with_no_pivot,
               vector<int,_std::allocator<int>_> *col_with_no_pivot)

{
  uint uVar1;
  ulong uVar2;
  
  if (highs_debug_level != 0) {
    if (call_id == 1) {
      if (rank_deficiency < 0x65) {
        highsLogDev(log_options,kWarning,"buildRankDeficiency1:");
        highsLogDev(log_options,kWarning,"\nIndex  ");
        if (0 < rank_deficiency) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",uVar2);
            uVar1 = (int)uVar2 + 1;
            uVar2 = (ulong)uVar1;
          } while (rank_deficiency != uVar1);
        }
        highsLogDev(log_options,kWarning,"\nrow_with_no_pivot  ");
        if (0 < rank_deficiency) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",
                        (ulong)(uint)(row_with_no_pivot->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar2]);
            uVar2 = uVar2 + 1;
          } while ((uint)rank_deficiency != uVar2);
        }
        highsLogDev(log_options,kWarning,"\ncol_with_no_pivot  ");
        if (0 < rank_deficiency) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",
                        (ulong)(uint)(col_with_no_pivot->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar2]);
            uVar2 = uVar2 + 1;
          } while ((uint)rank_deficiency != uVar2);
        }
        highsLogDev(log_options,kWarning,"\n");
        if (num_row < 0x7c) {
          highsLogDev(log_options,kWarning,"Index  ");
          if (0 < num_row) {
            uVar2 = 0;
            do {
              highsLogDev(log_options,kWarning," %2d",uVar2);
              uVar1 = (int)uVar2 + 1;
              uVar2 = (ulong)uVar1;
            } while (num_row != uVar1);
          }
          highsLogDev(log_options,kWarning,"\nIwork  ");
          if (0 < num_row) {
            uVar2 = 0;
            do {
              highsLogDev(log_options,kWarning," %2d",
                          (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[uVar2]);
              uVar2 = uVar2 + 1;
            } while ((uint)num_row != uVar2);
          }
          goto LAB_003793b8;
        }
      }
    }
    else if (call_id == 0) {
      if (num_row < 0x7c) {
        highsLogDev(log_options,kWarning,"buildRankDeficiency0:");
        highsLogDev(log_options,kWarning,"\nIndex  ");
        if (0 < num_row) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",uVar2);
            uVar1 = (int)uVar2 + 1;
            uVar2 = (ulong)uVar1;
          } while (num_row != uVar1);
        }
        highsLogDev(log_options,kWarning,"\nPerm   ");
        if (0 < num_row) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",
                        (ulong)(uint)(permute->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start[uVar2]);
            uVar2 = uVar2 + 1;
          } while ((uint)num_row != uVar2);
        }
        highsLogDev(log_options,kWarning,"\nIwork  ");
        if (0 < num_row) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",
                        (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar2]);
            uVar2 = uVar2 + 1;
          } while ((uint)num_row != uVar2);
        }
        highsLogDev(log_options,kWarning,"\nBaseI  ");
        if (0 < num_row) {
          uVar2 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar2]);
            uVar2 = uVar2 + 1;
          } while ((uint)num_row != uVar2);
        }
LAB_003793b8:
        highsLogDev(log_options,kWarning,"\n");
        return;
      }
    }
    else if (num_row < 0x7c && call_id == 2) {
      highsLogDev(log_options,kWarning,"buildRankDeficiency2:");
      highsLogDev(log_options,kWarning,"\nIndex  ");
      if (0 < num_row) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",uVar2);
          uVar1 = (int)uVar2 + 1;
          uVar2 = (ulong)uVar1;
        } while (num_row != uVar1);
      }
      highsLogDev(log_options,kWarning,"\nPerm   ");
      if (0 < num_row) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(permute->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
      }
      goto LAB_003793b8;
    }
  }
  return;
}

Assistant:

void debugReportRankDeficiency(
    const HighsInt call_id, const HighsInt highs_debug_level,
    const HighsLogOptions& log_options, const HighsInt num_row,
    const vector<HighsInt>& permute, const vector<HighsInt>& iwork,
    const HighsInt* basic_index, const HighsInt rank_deficiency,
    const vector<HighsInt>& row_with_no_pivot,
    const vector<HighsInt>& col_with_no_pivot) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (call_id == 0) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency0:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 1) {
    if (rank_deficiency > 100) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency1:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nrow_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  row_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\ncol_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  col_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "Index  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 2) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency2:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}